

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O0

VariableStruct * __thiscall
adios2::core::IO::InquireStructVariable
          (IO *this,string *name,StructDefinition *def,bool allowReorganize)

{
  bool bVar1;
  DataType DVar2;
  DataType DVar3;
  size_t sVar4;
  size_t sVar5;
  byte in_CL;
  size_t in_stack_00000028;
  StructDefinition *in_stack_00000030;
  StructDefinition *in_stack_00000038;
  size_t i;
  VariableStruct *ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  string local_78 [24];
  string *in_stack_ffffffffffffffa0;
  IO *in_stack_ffffffffffffffa8;
  ulong local_38;
  VariableStruct *local_8;
  
  local_8 = InquireStructVariable(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  if (local_8 == (VariableStruct *)0x0) {
    local_8 = (VariableStruct *)0x0;
  }
  else {
    sVar4 = StructDefinition::Fields((StructDefinition *)0x8a2167);
    sVar5 = StructDefinition::Fields((StructDefinition *)0x8a2179);
    if (sVar4 == sVar5) {
      for (local_38 = 0; sVar4 = StructDefinition::Fields((StructDefinition *)0x8a21bd),
          local_38 < sVar4; local_38 = local_38 + 1) {
        StructDefinition::Name_abi_cxx11_(in_stack_00000038,(size_t)in_stack_00000030);
        StructDefinition::Name_abi_cxx11_(in_stack_00000038,(size_t)in_stack_00000030);
        bVar1 = std::operator!=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        std::__cxx11::string::~string(local_78);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
        if (bVar1) {
          return (VariableStruct *)0x0;
        }
        sVar4 = StructDefinition::Offset(in_stack_00000030,in_stack_00000028);
        sVar5 = StructDefinition::Offset(in_stack_00000030,in_stack_00000028);
        if ((sVar4 != sVar5) && ((in_CL & 1) == 0)) {
          return (VariableStruct *)0x0;
        }
        DVar2 = StructDefinition::Type(in_stack_00000030,in_stack_00000028);
        DVar3 = StructDefinition::Type(in_stack_00000030,in_stack_00000028);
        if (DVar2 != DVar3) {
          return (VariableStruct *)0x0;
        }
        in_stack_ffffffffffffff50 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             StructDefinition::ElementCount(in_stack_00000030,in_stack_00000028);
        in_stack_ffffffffffffff48 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             StructDefinition::ElementCount(in_stack_00000030,in_stack_00000028);
        if (in_stack_ffffffffffffff50 != in_stack_ffffffffffffff48) {
          return (VariableStruct *)0x0;
        }
      }
    }
    else {
      local_8 = (VariableStruct *)0x0;
    }
  }
  return local_8;
}

Assistant:

VariableStruct *IO::InquireStructVariable(const std::string &name, const StructDefinition &def,
                                          const bool allowReorganize) noexcept
{
    auto ret = InquireStructVariable(name);
    if (ret == nullptr)
    {
        return nullptr;
    }

    if (ret->m_WriteStructDefinition->Fields() != def.Fields())
    {
        return nullptr;
    }

    for (size_t i = 0; i < def.Fields(); ++i)
    {
        if (ret->m_WriteStructDefinition->Name(i) != def.Name(i))
        {
            return nullptr;
        }
        if (ret->m_WriteStructDefinition->Offset(i) != def.Offset(i) && !allowReorganize)
        {
            return nullptr;
        }
        if (ret->m_WriteStructDefinition->Type(i) != def.Type(i))
        {
            return nullptr;
        }
        if (ret->m_WriteStructDefinition->ElementCount(i) != def.ElementCount(i))
        {
            return nullptr;
        }
    }

    return ret;
}